

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

void __thiscall duckdb::QueryProfiler::QueryTreeToStream(QueryProfiler *this,ostream *ss)

{
  unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true> *this_00;
  pointer this_01;
  ClientContextState *pCVar1;
  pointer pPVar2;
  type node;
  char *this_02;
  shared_ptr<duckdb::ClientContextState,_true> *state;
  _Alloc_hider this_03;
  double timing;
  allocator local_d2;
  allocator local_d1;
  string total_time;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ::std::mutex::lock(&this->lock);
  ::std::operator<<(ss,anon_var_dwarf_2f9576b);
  ::std::operator<<(ss,anon_var_dwarf_2f95777);
  ::std::operator<<(ss,anon_var_dwarf_2f95783);
  ::std::operator<<(ss,anon_var_dwarf_2f9578f);
  ::std::operator<<(ss,anon_var_dwarf_2f9579b);
  ::std::__cxx11::string::string((string *)&local_50,(string *)&this->query_info);
  ::std::__cxx11::string::string((string *)&local_70,anon_var_dwarf_3b2a754 + 8,&local_d1);
  ::std::__cxx11::string::string((string *)&local_90," ",&local_d2);
  StringUtil::Replace(&local_b0,&local_50,&local_70,&local_90);
  ::std::operator+(&total_time,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                   anon_var_dwarf_3b2a754 + 8);
  ::std::operator<<(ss,(string *)&total_time);
  ::std::__cxx11::string::~string((string *)&total_time);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  if (((this->query_info).query_name._M_string_length != 0) ||
     ((this->root).
      super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t.
      super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>.
      super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl != (ProfilingNode *)0x0)) {
    this_01 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
              ::operator->(&this->context->registered_state);
    RegisteredStateManager::States
              ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)&total_time,
               this_01);
    this_00 = &this->root;
    for (this_03 = total_time._M_dataplus; this_03._M_p != (pointer)total_time._M_string_length;
        this_03._M_p = this_03._M_p + 0x10) {
      pCVar1 = shared_ptr<duckdb::ClientContextState,_true>::operator->
                         ((shared_ptr<duckdb::ClientContextState,_true> *)this_03._M_p);
      (**(code **)(*(long *)pCVar1 + 0x78))(pCVar1,ss);
    }
    ::std::
    vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
    ::~vector((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
               *)&total_time);
    ::std::operator<<(ss,anon_var_dwarf_2f956b7);
    this_02 = anon_var_dwarf_2f956f3;
    ::std::operator<<(ss,anon_var_dwarf_2f956f3);
    timing = BaseProfiler<std::chrono::_V2::steady_clock>::Elapsed(&this->main_query);
    RenderTiming_abi_cxx11_((string *)&local_b0,(duckdb *)this_02,timing);
    ::std::operator+(&total_time,"Total Time: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0)
    ;
    ::std::__cxx11::string::~string((string *)&local_b0);
    DrawPadded((string *)&local_90,&total_time,0x2e);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     anon_var_dwarf_2f956ff,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90)
    ;
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     anon_var_dwarf_2f95783 + 0x29);
    ::std::operator<<(ss,(string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::operator<<(ss,anon_var_dwarf_2f95717);
    ::std::operator<<(ss,anon_var_dwarf_2f95723);
    if ((this_00->
        super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>)._M_t.
        super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
        .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl != (ProfilingNode *)0x0)
    {
      if (((this->context->config).profiler_print_format == QUERY_TREE_OPTIMIZER) ||
         ((this->is_explain_analyze == false &&
          ((this->context->config).enable_detailed_profiling == true)))) {
        pPVar2 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                 ::operator->(this_00);
        PrintPhaseTimingsToStream(ss,&pPVar2->profiling_info,0x32);
      }
      node = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
             operator*(this_00);
      Render(this,node,ss);
    }
    ::std::__cxx11::string::~string((string *)&total_time);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

void QueryProfiler::QueryTreeToStream(std::ostream &ss) const {
	lock_guard<std::mutex> guard(lock);
	ss << "┌─────────────────────────────────────┐\n";
	ss << "│┌───────────────────────────────────┐│\n";
	ss << "││    Query Profiling Information    ││\n";
	ss << "│└───────────────────────────────────┘│\n";
	ss << "└─────────────────────────────────────┘\n";
	ss << StringUtil::Replace(query_info.query_name, "\n", " ") + "\n";

	// checking the tree to ensure the query is really empty
	// the query string is empty when a logical plan is deserialized
	if (query_info.query_name.empty() && !root) {
		return;
	}

	for (auto &state : context.registered_state->States()) {
		state->WriteProfilingInformation(ss);
	}

	constexpr idx_t TOTAL_BOX_WIDTH = 50;
	ss << "┌────────────────────────────────────────────────┐\n";
	ss << "│┌──────────────────────────────────────────────┐│\n";
	string total_time = "Total Time: " + RenderTiming(main_query.Elapsed());
	ss << "││" + DrawPadded(total_time, TOTAL_BOX_WIDTH - 4) + "││\n";
	ss << "│└──────────────────────────────────────────────┘│\n";
	ss << "└────────────────────────────────────────────────┘\n";
	// render the main operator tree
	if (root) {
		// print phase timings
		if (PrintOptimizerOutput()) {
			PrintPhaseTimingsToStream(ss, root->GetProfilingInfo(), TOTAL_BOX_WIDTH);
		}
		Render(*root, ss);
	}
}